

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  int iVar1;
  object_api<pybind11::handle> *in_RDX;
  char *in_RSI;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  cpp_function *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  byte bVar2;
  byte bVar3;
  object_api<pybind11::handle> *in_stack_ffffffffffffff60;
  handle in_stack_ffffffffffffff68;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
  *in_stack_ffffffffffffff70;
  cpp_function local_78 [6];
  undefined8 local_48;
  undefined8 local_40;
  char *local_10;
  
  local_10 = in_RSI;
  cpp_function::name((cpp_function *)in_stack_ffffffffffffff68.m_ptr);
  local_40 = local_48;
  object_api<pybind11::handle>::attr(in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
  accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)
             CONCAT17(in_stack_ffffffffffffff47,
                      CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
             in_stack_ffffffffffffff38);
  accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  object::~object((object *)0x16b4c0);
  iVar1 = strcmp(local_10,"__eq__");
  bVar2 = 0;
  bVar3 = bVar2;
  if (iVar1 == 0) {
    in_stack_ffffffffffffff38 = local_78;
    object_api<pybind11::handle>::attr
              (in_RDX,(char *)(ulong)CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff46 =
         object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
         contains<char_const(&)[9]>
                   (in_stack_ffffffffffffff70,(char (*) [9])in_stack_ffffffffffffff68.m_ptr);
    bVar2 = in_stack_ffffffffffffff46 ^ 0xff;
    bVar3 = bVar2;
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x16b545);
  }
  if ((bVar2 & 1) != 0) {
    none::none((none *)CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40))
              );
    object_api<pybind11::handle>::attr
              (in_RDX,(char *)CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff46,
                                                      in_stack_ffffffffffffff40)));
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)
               CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
               (none *)in_stack_ffffffffffffff38);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x16b592);
    none::~none((none *)0x16b59c);
  }
  return;
}

Assistant:

inline void add_class_method(object& cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
      cls.attr("__hash__") = none();
    }
}